

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecoration
          (DecorationManager *this,Instruction *inst)

{
  Op OVar1;
  ulong uVar2;
  uint32_t uVar3;
  __node_base_ptr p_Var4;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  _Var5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  uint index;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint uVar10;
  anon_class_8_1_898d1344 remove_from_container;
  Instruction *local_38;
  
  OVar1 = inst->opcode_;
  local_38 = inst;
  if ((int)OVar1 < 0x14c) {
    if (1 < OVar1 - OpDecorate) {
      if (1 < OVar1 - OpGroupDecorate) {
        return;
      }
      index = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        index = (uint)inst->has_result_id_;
      }
      if (1 < (int)((ulong)((long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              index) {
        uVar10 = 1;
        do {
          uVar3 = Instruction::GetSingleWordOperand(inst,index + uVar10);
          uVar2 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
          uVar6 = (ulong)uVar3 % uVar2;
          p_Var9 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar6];
          p_Var4 = (__node_base_ptr)0x0;
          if ((p_Var9 != (__node_base_ptr)0x0) &&
             (p_Var4 = p_Var9, p_Var8 = p_Var9->_M_nxt,
             uVar3 != *(uint32_t *)&p_Var9->_M_nxt[1]._M_nxt)) {
            while (p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var4 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar6) ||
                 (p_Var4 = p_Var8, p_Var8 = p_Var7, uVar3 == *(uint *)&p_Var7[1]._M_nxt))
              goto LAB_001f322a;
            }
            p_Var4 = (__node_base_ptr)0x0;
          }
LAB_001f322a:
          if (p_Var4 == (__node_base_ptr)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var7 = p_Var4->_M_nxt;
          }
          if ((p_Var7 != (_Hash_node_base *)0x0) &&
             (_Var5 = std::
                      __remove_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Instruction*const>>
                                ((__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  )p_Var7[5]._M_nxt,
                                 (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  )p_Var7[6]._M_nxt,&local_38),
             (_Hash_node_base *)_Var5._M_current != p_Var7[6]._M_nxt)) {
            p_Var7[6]._M_nxt = (_Hash_node_base *)_Var5._M_current;
          }
          uVar10 = uVar10 + (OVar1 != OpGroupDecorate) + 1;
          index = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            index = (uint)inst->has_result_id_;
          }
        } while (uVar10 < (int)((ulong)((long)(inst->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555 - index);
      }
      uVar3 = Instruction::GetSingleWordOperand(inst,index);
      uVar2 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
      uVar6 = (ulong)uVar3 % uVar2;
      p_Var9 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar6];
      p_Var4 = (__node_base_ptr)0x0;
      if ((p_Var9 != (__node_base_ptr)0x0) &&
         (p_Var7 = p_Var9->_M_nxt, p_Var4 = p_Var9, uVar3 != *(uint32_t *)&p_Var9->_M_nxt[1]._M_nxt)
         ) {
        while (p_Var9 = p_Var7, p_Var7 = p_Var9->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
          p_Var4 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar6) ||
             (p_Var4 = p_Var9, uVar3 == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_001f33b2;
        }
        p_Var4 = (__node_base_ptr)0x0;
      }
LAB_001f33b2:
      if (p_Var4 == (__node_base_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var7 = p_Var4->_M_nxt;
      }
      if (p_Var7 == (_Hash_node_base *)0x0) {
        return;
      }
      _Var5 = std::
              __remove_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Instruction*const>>
                        ((__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )p_Var7[8]._M_nxt,
                         (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )p_Var7[9]._M_nxt,&local_38);
      if ((_Hash_node_base *)_Var5._M_current == p_Var7[9]._M_nxt) {
        return;
      }
      p_Var7 = p_Var7 + 9;
      goto LAB_001f33dd;
    }
  }
  else if ((OVar1 != OpDecorateString) && (OVar1 != OpDecorateId)) {
    return;
  }
  uVar3 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar3 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
  uVar2 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
  uVar6 = (ulong)uVar3 % uVar2;
  p_Var9 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar6];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var9->_M_nxt, p_Var4 = p_Var9, uVar3 != *(uint32_t *)&p_Var9->_M_nxt[1]._M_nxt)) {
    while (p_Var9 = p_Var7, p_Var7 = p_Var9->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var4 = p_Var9, uVar3 == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_001f3382;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_001f3382:
  if (p_Var4 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var4->_M_nxt;
  }
  if (p_Var7 == (_Hash_node_base *)0x0) {
    return;
  }
  _Var5 = std::
          __remove_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Instruction*const>>
                    ((__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      )p_Var7[2]._M_nxt,
                     (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      )p_Var7[3]._M_nxt,&local_38);
  if ((_Hash_node_base *)_Var5._M_current == p_Var7[3]._M_nxt) {
    return;
  }
  p_Var7 = p_Var7 + 3;
LAB_001f33dd:
  p_Var7->_M_nxt = (_Hash_node_base *)_Var5._M_current;
  return;
}

Assistant:

void DecorationManager::RemoveDecoration(Instruction* inst) {
  const auto remove_from_container = [inst](std::vector<Instruction*>& v) {
    v.erase(std::remove(v.begin(), v.end(), inst), v.end());
  };

  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorate: {
      const auto target_id = inst->GetSingleWordInOperand(0u);
      auto const iter = id_to_decoration_insts_.find(target_id);
      if (iter == id_to_decoration_insts_.end()) return;
      remove_from_container(iter->second.direct_decorations);
    } break;
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate: {
      const uint32_t stride =
          inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
      for (uint32_t i = 1u; i < inst->NumInOperands(); i += stride) {
        const auto target_id = inst->GetSingleWordInOperand(i);
        auto const iter = id_to_decoration_insts_.find(target_id);
        if (iter == id_to_decoration_insts_.end()) continue;
        remove_from_container(iter->second.indirect_decorations);
      }
      const auto group_id = inst->GetSingleWordInOperand(0u);
      auto const iter = id_to_decoration_insts_.find(group_id);
      if (iter == id_to_decoration_insts_.end()) return;
      remove_from_container(iter->second.decorate_insts);
    } break;
    default:
      break;
  }
}